

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# KDataStream.h
# Opt level: O2

void __thiscall KDIS::KDataStream::Write<double>(KDataStream *this,double T)

{
  KUINT8 i;
  long lVar1;
  NetToDataType<double> OctArray;
  uchar local_21;
  NetToDataType<double> local_20;
  
  local_20.m_Value = T;
  if (this->m_MachineEndian != this->m_NetEndian) {
    NetToDataType<double>::SwapBytes(&local_20);
  }
  for (lVar1 = 0; lVar1 != 8; lVar1 = lVar1 + 1) {
    local_21 = *(uchar *)((long)&local_20 + lVar1);
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::emplace_back<unsigned_char>
              (&this->m_vBuffer,&local_21);
  }
  return;
}

Assistant:

void KDataStream::Write( Type T )
{
    KBOOL bSwapBytes = true;
    if (m_MachineEndian == m_NetEndian)
        bSwapBytes = false;

    NetToDataType<Type> OctArray( T, bSwapBytes );

    for( KUINT8 i = 0; i < sizeof T; ++i )
    {
        m_vBuffer.push_back( OctArray.m_Octs[i] );
    }
}